

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

double __thiscall
fasttext::Meter::recallAtPrecision(Meter *this,int32_t labelId,double precisionQuery)

{
  double dVar1;
  pointer ppVar2;
  double dVar3;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_20;
  
  precisionRecallCurve(&local_20,this,labelId);
  dVar1 = 0.0;
  for (ppVar2 = local_20.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != local_20.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    dVar3 = dVar1;
    if ((precisionQuery <= ppVar2->first) && (dVar3 = ppVar2->second, ppVar2->second <= dVar1)) {
      dVar3 = dVar1;
    }
    dVar1 = dVar3;
  }
  if (local_20.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return dVar1;
}

Assistant:

double Meter::recallAtPrecision(int32_t labelId, double precisionQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestRecall = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestRecall, precisionQuery](const std::pair<double, double>& element) {
        if (element.first >= precisionQuery) {
          bestRecall = std::max(bestRecall, element.second);
        };
      });
  return bestRecall;
}